

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playableWorld.cpp
# Opt level: O1

void __thiscall
playableWorld::playableWorld
          (playableWorld *this,pair<int,_int> agent_locationn,string *agent_directionn,World *worldd
          )

{
  World *this_00;
  int iVar1;
  
  this->pl = 0;
  this_00 = &this->world;
  World::World(this_00);
  (this->agent_direction)._M_dataplus._M_p = (pointer)&(this->agent_direction).field_2;
  (this->agent_direction)._M_string_length = 0;
  (this->agent_direction).field_2._M_local_buf[0] = '\0';
  (this->agent_location).first = agent_locationn.first;
  (this->agent_location).second = agent_locationn.second;
  std::__cxx11::string::_M_assign((string *)&this->agent_direction);
  *(undefined4 *)((long)&(this->world).pos + 3) = *(undefined4 *)((long)&worldd->pos + 3);
  iVar1 = worldd->pos;
  this_00->size = worldd->size;
  this_00->pos = iVar1;
  (this->world).wumpus_location.first = (worldd->wumpus_location).first;
  (this->world).wumpus_location.second = (worldd->wumpus_location).second;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
            (&(this->world).pit_locations,&worldd->pit_locations);
  (this->world).gold_location.first = (worldd->gold_location).first;
  (this->world).gold_location.second = (worldd->gold_location).second;
  std::
  vector<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
  ::operator=(&(this->world).boxes,&worldd->boxes);
  return;
}

Assistant:

playableWorld::playableWorld(pair<int, int> agent_locationn, string agent_directionn,World worldd )
{
  agent_location = agent_locationn;
  agent_direction = agent_directionn;
  world=worldd;


}